

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_test.cc
# Opt level: O0

void leveldb::ConsumeDecimalNumberRoundtripTest(uint64_t number,string *padding)

{
  bool b;
  char *pcVar1;
  char *pcVar2;
  size_t local_730;
  unsigned_long local_728;
  Tester local_720;
  long local_580;
  unsigned_long local_578;
  Tester local_570;
  Tester local_3d0;
  Tester local_230;
  uint64_t local_90;
  uint64_t result;
  Slice output;
  Slice input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [8];
  string input_string;
  leveldb local_38 [8];
  string decimal_number;
  string *padding_local;
  uint64_t number_local;
  
  padding_local = (string *)number;
  NumberToString_abi_cxx11_(local_38,number);
  std::operator+(local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
  Slice::Slice((Slice *)&output.size_,local_58);
  result = output.size_;
  test::Tester::Tester
            (&local_230,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
             ,0x30);
  b = ConsumeDecimalNumber((Slice *)&result,&local_90);
  test::Tester::Is(&local_230,b,"ConsumeDecimalNumber(&output, &result)");
  test::Tester::~Tester(&local_230);
  test::Tester::Tester
            (&local_3d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
             ,0x31);
  test::Tester::IsEq<unsigned_long,unsigned_long>
            (&local_3d0,(unsigned_long *)&padding_local,&local_90);
  test::Tester::~Tester(&local_3d0);
  test::Tester::Tester
            (&local_570,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
             ,0x32);
  local_578 = std::__cxx11::string::size();
  pcVar1 = Slice::data((Slice *)&result);
  pcVar2 = Slice::data((Slice *)&output.size_);
  local_580 = (long)pcVar1 - (long)pcVar2;
  test::Tester::IsEq<unsigned_long,long>(&local_570,&local_578,&local_580);
  test::Tester::~Tester(&local_570);
  test::Tester::Tester
            (&local_720,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
             ,0x33);
  local_728 = std::__cxx11::string::size();
  local_730 = Slice::size((Slice *)&result);
  test::Tester::IsEq<unsigned_long,unsigned_long>(&local_720,&local_728,&local_730);
  test::Tester::~Tester(&local_720);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ConsumeDecimalNumberRoundtripTest(uint64_t number,
                                       const std::string& padding = "") {
  std::string decimal_number = NumberToString(number);
  std::string input_string = decimal_number + padding;
  Slice input(input_string);
  Slice output = input;
  uint64_t result;
  ASSERT_TRUE(ConsumeDecimalNumber(&output, &result));
  ASSERT_EQ(number, result);
  ASSERT_EQ(decimal_number.size(), output.data() - input.data());
  ASSERT_EQ(padding.size(), output.size());
}